

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

double __thiscall Quat4f::log(Quat4f *this,double __x)

{
  ulong uVar1;
  undefined8 uVar2;
  float *in_RSI;
  double dVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  uVar1 = *(ulong *)(in_RSI + 1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar7._0_4_ = (float)uVar1 * (float)uVar1;
  fVar6 = (float)(uVar1 >> 0x20);
  auVar7._4_4_ = fVar6 * fVar6;
  auVar7._8_8_ = 0;
  auVar7 = vmovshdup_avx(auVar7);
  fVar6 = in_RSI[3];
  auVar7 = vfmadd231ss_fma(auVar7,auVar4,auVar4);
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  if (1e-06 <= (double)auVar7._0_4_) {
    dVar3 = acos((double)*in_RSI);
    fVar5 = (float)(dVar3 / (double)auVar7._0_4_);
    fVar6 = fVar5 * in_RSI[3];
    auVar4._0_4_ = (float)*(undefined8 *)(in_RSI + 1) * fVar5;
    auVar4._4_4_ = (float)((ulong)*(undefined8 *)(in_RSI + 1) >> 0x20) * fVar5;
    auVar4._8_4_ = fVar5 * 0.0;
    auVar4._12_4_ = fVar5 * 0.0;
  }
  this->m_elements[0] = 0.0;
  uVar2 = vmovlps_avx(auVar4);
  *(undefined8 *)(this->m_elements + 1) = uVar2;
  this->m_elements[3] = fVar6;
  return auVar4._0_8_;
}

Assistant:

Quat4f Quat4f::log() const
{
	float len =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( len < 1e-6 )
	{
		return Quat4f( 0, m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = acos( m_elements[ 0 ] ) / len;
		return Quat4f( 0, m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );
	}
}